

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O0

void __thiscall
t_haxe_generator::generate_deserialize_container
          (t_haxe_generator *this,ostream *out,t_type *ttype,string *prefix)

{
  uint uVar1;
  ostream *poVar2;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  allocator local_191;
  string local_190;
  undefined1 local_170 [8];
  string i;
  allocator local_129;
  string local_128;
  string local_108;
  allocator local_e1;
  string local_e0;
  string local_c0;
  allocator local_99;
  string local_98;
  string local_78;
  string local_48 [8];
  string obj;
  string *prefix_local;
  t_type *ttype_local;
  ostream *out_local;
  t_haxe_generator *this_local;
  
  obj.field_2._8_8_ = prefix;
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  std::__cxx11::string::string(local_48);
  uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])();
  if ((uVar1 & 1) == 0) {
    uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
    if ((uVar1 & 1) == 0) {
      uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
      if ((uVar1 & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_128,"_list",&local_129);
        t_generator::tmp(&local_108,(t_generator *)this,&local_128);
        std::__cxx11::string::operator=(local_48,(string *)&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&local_128);
        std::allocator<char>::~allocator((allocator<char> *)&local_129);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_e0,"_set",&local_e1);
      t_generator::tmp(&local_c0,(t_generator *)this,&local_e0);
      std::__cxx11::string::operator=(local_48,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_98,"_map",&local_99);
    t_generator::tmp(&local_78,(t_generator *)this,&local_98);
    std::__cxx11::string::operator=(local_48,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
  }
  uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])();
  if ((uVar1 & 1) == 0) {
    uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
    if ((uVar1 & 1) == 0) {
      uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
      if ((uVar1 & 1) != 0) {
        poVar2 = t_generator::indent((t_generator *)this,out);
        poVar2 = std::operator<<(poVar2,"var ");
        poVar2 = std::operator<<(poVar2,local_48);
        poVar2 = std::operator<<(poVar2," = iprot.readListBegin();");
        std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      }
    }
    else {
      poVar2 = t_generator::indent((t_generator *)this,out);
      poVar2 = std::operator<<(poVar2,"var ");
      poVar2 = std::operator<<(poVar2,local_48);
      poVar2 = std::operator<<(poVar2," = iprot.readSetBegin();");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    }
  }
  else {
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"var ");
    poVar2 = std::operator<<(poVar2,local_48);
    poVar2 = std::operator<<(poVar2," = iprot.readMapBegin();");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  }
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,(string *)prefix);
  poVar2 = std::operator<<(poVar2," = new ");
  type_name_abi_cxx11_((string *)((long)&i.field_2 + 8),this,ttype,false,true);
  poVar2 = std::operator<<(poVar2,(string *)(i.field_2._M_local_buf + 8));
  poVar2 = std::operator<<(poVar2,"(");
  poVar2 = std::operator<<(poVar2,");");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)(i.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_190,"_i",&local_191);
  t_generator::tmp((string *)local_170,(t_generator *)this,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  poVar2 = t_generator::indent((t_generator *)this,out);
  poVar2 = std::operator<<(poVar2,"for( ");
  poVar2 = std::operator<<(poVar2,(string *)local_170);
  poVar2 = std::operator<<(poVar2," in 0 ... ");
  poVar2 = std::operator<<(poVar2,local_48);
  poVar2 = std::operator<<(poVar2,".size)");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])();
  if ((uVar1 & 1) == 0) {
    uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
    if ((uVar1 & 1) == 0) {
      uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
      if ((uVar1 & 1) != 0) {
        std::__cxx11::string::string((string *)&local_1f8,(string *)prefix);
        generate_deserialize_list_element(this,out,(t_list *)ttype,&local_1f8);
        std::__cxx11::string::~string((string *)&local_1f8);
      }
    }
    else {
      std::__cxx11::string::string((string *)&local_1d8,(string *)prefix);
      generate_deserialize_set_element(this,out,(t_set *)ttype,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_1b8,(string *)prefix);
    generate_deserialize_map_element(this,out,(t_map *)ttype,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])();
  if ((uVar1 & 1) == 0) {
    uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
    if ((uVar1 & 1) == 0) {
      uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
      if ((uVar1 & 1) != 0) {
        poVar2 = t_generator::indent((t_generator *)this,out);
        poVar2 = std::operator<<(poVar2,"iprot.readListEnd();");
        std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      }
    }
    else {
      poVar2 = t_generator::indent((t_generator *)this,out);
      poVar2 = std::operator<<(poVar2,"iprot.readSetEnd();");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    }
  }
  else {
    poVar2 = t_generator::indent((t_generator *)this,out);
    poVar2 = std::operator<<(poVar2,"iprot.readMapEnd();");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  std::__cxx11::string::~string((string *)local_170);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void t_haxe_generator::generate_deserialize_container(ostream& out, t_type* ttype, string prefix) {
  scope_up(out);

  string obj;

  if (ttype->is_map()) {
    obj = tmp("_map");
  } else if (ttype->is_set()) {
    obj = tmp("_set");
  } else if (ttype->is_list()) {
    obj = tmp("_list");
  }

  // Declare variables, read header
  if (ttype->is_map()) {
    indent(out) << "var " << obj << " = iprot.readMapBegin();" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "var " << obj << " = iprot.readSetBegin();" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "var " << obj << " = iprot.readListBegin();" << endl;
  }

  indent(out) << prefix << " = new " << type_name(ttype, false, true)
              // size the collection correctly
              << "("
              << ");" << endl;

  // For loop iterates over elements
  string i = tmp("_i");
  indent(out) << "for( " << i << " in 0 ... " << obj << ".size)" << endl;

  scope_up(out);

  if (ttype->is_map()) {
    generate_deserialize_map_element(out, (t_map*)ttype, prefix);
  } else if (ttype->is_set()) {
    generate_deserialize_set_element(out, (t_set*)ttype, prefix);
  } else if (ttype->is_list()) {
    generate_deserialize_list_element(out, (t_list*)ttype, prefix);
  }

  scope_down(out);

  // Read container end
  if (ttype->is_map()) {
    indent(out) << "iprot.readMapEnd();" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "iprot.readSetEnd();" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "iprot.readListEnd();" << endl;
  }

  scope_down(out);
}